

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Iterator * __thiscall
leveldb::DBImpl::NewInternalIterator
          (DBImpl *this,ReadOptions *options,SequenceNumber *latest_snapshot,uint32_t *seed)

{
  long lVar1;
  uint64_t uVar2;
  Iterator *this_00;
  Version *this_01;
  int iVar3;
  int *in_RCX;
  Mutex *mutex;
  uint64_t *in_RDX;
  long in_RDI;
  long in_FS_OFFSET;
  IterState *cleanup;
  Iterator *internal_iter;
  vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> list;
  VersionSet *in_stack_ffffffffffffff08;
  MemTable *in_stack_ffffffffffffff10;
  MemTable *in_stack_ffffffffffffff18;
  MemTable *in_stack_ffffffffffffff28;
  IterState *this_02;
  undefined8 in_stack_ffffffffffffff30;
  CleanupFunction func;
  Iterator **in_stack_ffffffffffffff38;
  Comparator *in_stack_ffffffffffffff40;
  vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *in_stack_ffffffffffffff48;
  ReadOptions *in_stack_ffffffffffffff50;
  Version *in_stack_ffffffffffffff58;
  
  iVar3 = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  port::Mutex::Lock((Mutex *)in_stack_ffffffffffffff08);
  uVar2 = VersionSet::LastSequence(in_stack_ffffffffffffff08);
  *in_RDX = uVar2;
  std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::vector
            ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)
             in_stack_ffffffffffffff08);
  MemTable::NewIterator(in_stack_ffffffffffffff28);
  std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::push_back
            ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)
             in_stack_ffffffffffffff08,(value_type *)0xd13641);
  MemTable::Ref((MemTable *)in_stack_ffffffffffffff08);
  if (*(long *)(in_RDI + 0x138) != 0) {
    MemTable::NewIterator(in_stack_ffffffffffffff28);
    std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::push_back
              ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)
               in_stack_ffffffffffffff08,(value_type *)0xd1369f);
    MemTable::Ref((MemTable *)in_stack_ffffffffffffff08);
  }
  VersionSet::current(in_stack_ffffffffffffff08);
  Version::AddIterators
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::operator[]
            ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)
             in_stack_ffffffffffffff18,(size_type)in_stack_ffffffffffffff10);
  std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::size
            ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)
             in_stack_ffffffffffffff08);
  this_00 = NewMergingIterator(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,iVar3);
  VersionSet::current(in_stack_ffffffffffffff08);
  Version::Ref((Version *)in_stack_ffffffffffffff08);
  operator_new(0x20);
  mutex = (Mutex *)(in_RDI + 200);
  this_02 = *(IterState **)(in_RDI + 0x130);
  func = *(CleanupFunction *)(in_RDI + 0x138);
  this_01 = VersionSet::current(in_stack_ffffffffffffff08);
  anon_unknown_35::IterState::IterState
            (this_02,mutex,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (Version *)in_stack_ffffffffffffff08);
  Iterator::RegisterCleanup((Iterator *)this_01,func,this_02,mutex);
  iVar3 = *(int *)(in_RDI + 0x160) + 1;
  *(int *)(in_RDI + 0x160) = iVar3;
  *in_RCX = iVar3;
  port::Mutex::Unlock((Mutex *)in_stack_ffffffffffffff08);
  std::vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_>::~vector
            ((vector<leveldb::Iterator_*,_std::allocator<leveldb::Iterator_*>_> *)this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return this_00;
  }
  __stack_chk_fail();
}

Assistant:

Iterator* DBImpl::NewInternalIterator(const ReadOptions& options,
                                      SequenceNumber* latest_snapshot,
                                      uint32_t* seed) {
  mutex_.Lock();
  *latest_snapshot = versions_->LastSequence();

  // Collect together all needed child iterators
  std::vector<Iterator*> list;
  list.push_back(mem_->NewIterator());
  mem_->Ref();
  if (imm_ != nullptr) {
    list.push_back(imm_->NewIterator());
    imm_->Ref();
  }
  versions_->current()->AddIterators(options, &list);
  Iterator* internal_iter =
      NewMergingIterator(&internal_comparator_, &list[0], list.size());
  versions_->current()->Ref();

  IterState* cleanup = new IterState(&mutex_, mem_, imm_, versions_->current());
  internal_iter->RegisterCleanup(CleanupIteratorState, cleanup, nullptr);

  *seed = ++seed_;
  mutex_.Unlock();
  return internal_iter;
}